

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_pcm_s32_to_s32(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  ulong uVar1;
  size_t __n;
  
  for (uVar1 = count << 2; uVar1 != 0; uVar1 = uVar1 - __n) {
    __n = 0xffffffff;
    if (uVar1 < 0xffffffff) {
      __n = uVar1;
    }
    memcpy(dst,src,__n);
    dst = (void *)((long)dst + __n);
    src = (void *)((long)src + __n);
  }
  return;
}

Assistant:

MA_API void ma_pcm_s32_to_s32(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
    (void)ditherMode;

    ma_copy_memory_64(dst, src, count * sizeof(ma_int32));
}